

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O2

bool __thiscall
spvtools::SpirvTools::Assemble
          (SpirvTools *this,char *text,size_t text_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,uint32_t options)

{
  spv_result_t sVar1;
  spv_binary spvbinary;
  spv_binary local_18;
  
  local_18 = (spv_binary)0x0;
  sVar1 = spvTextToBinaryWithOptions
                    (((this->impl_)._M_t.
                      super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                      .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl)->
                     context,text,text_size,options,&local_18,(spv_diagnostic *)0x0);
  if (sVar1 == SPV_SUCCESS) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,local_18->code,
               local_18->code + local_18->wordCount);
  }
  spvBinaryDestroy(local_18);
  return sVar1 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Assemble(const char* text, const size_t text_size,
                          std::vector<uint32_t>* binary,
                          uint32_t options) const {
  spv_binary spvbinary = nullptr;
  spv_result_t status = spvTextToBinaryWithOptions(
      impl_->context, text, text_size, options, &spvbinary, nullptr);
  if (status == SPV_SUCCESS) {
    binary->assign(spvbinary->code, spvbinary->code + spvbinary->wordCount);
  }
  spvBinaryDestroy(spvbinary);
  return status == SPV_SUCCESS;
}